

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

RandSeqProductionSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::RandSeqProductionSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation>
          (BumpAllocator *this,Compilation *args,
          basic_string_view<char,_std::char_traits<char>_> *args_1,SourceLocation *args_2)

{
  string_view name;
  RandSeqProductionSymbol *pRVar1;
  Compilation *in_RCX;
  RandSeqProductionSymbol *in_RDX;
  SourceLocation in_RSI;
  size_t in_RDI;
  char *unaff_retaddr;
  size_t in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  BumpAllocator *in_stack_ffffffffffffffd8;
  
  pRVar1 = (RandSeqProductionSymbol *)
           allocate(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  name._M_str = unaff_retaddr;
  name._M_len = in_RDI;
  ast::RandSeqProductionSymbol::RandSeqProductionSymbol(in_RDX,in_RCX,name,in_RSI);
  return pRVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }